

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void __thiscall
ImFont::AddGlyph(ImFont *this,ImFontConfig *cfg,ImWchar codepoint,float x0,float y0,float x1,
                float y1,float u0,float v0,float u1,float v1,float advance_x)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  ImFontGlyph *pIVar4;
  ImFontAtlas *pIVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  ImFontGlyph *__dest;
  uint uVar8;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [64];
  undefined1 in_register_00001244 [60];
  undefined1 auVar11 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar13 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar14 [64];
  float fVar15;
  float fVar16;
  float advance_x_original;
  undefined1 auVar9 [16];
  undefined1 auVar12 [16];
  
  auVar14._4_60_ = in_register_000012c4;
  auVar14._0_4_ = y1;
  auVar13._4_60_ = in_register_00001284;
  auVar13._0_4_ = x1;
  auVar12 = auVar13._0_16_;
  auVar11._4_60_ = in_register_00001244;
  auVar11._0_4_ = y0;
  auVar10._4_60_ = in_register_00001204;
  auVar10._0_4_ = x0;
  auVar9 = auVar10._0_16_;
  if (cfg != (ImFontConfig *)0x0) {
    auVar7 = vminss_avx(ZEXT416((uint)cfg->GlyphMaxAdvanceX),ZEXT416((uint)advance_x));
    auVar6 = vcmpss_avx(ZEXT416((uint)advance_x),ZEXT416((uint)cfg->GlyphMinAdvanceX),1);
    auVar6 = vblendvps_avx(auVar7,ZEXT416((uint)cfg->GlyphMinAdvanceX),auVar6);
    fVar16 = auVar6._0_4_;
    if ((fVar16 != advance_x) || (NAN(fVar16) || NAN(advance_x))) {
      fVar15 = (fVar16 - advance_x) * 0.5;
      if ((cfg->PixelSnapH & 1U) != 0) {
        auVar9 = vcvtdq2ps_avx(ZEXT416((uint)(int)fVar15));
        fVar15 = auVar9._0_4_;
      }
      auVar9 = ZEXT416((uint)(fVar15 + x0));
      auVar12 = ZEXT416((uint)(fVar15 + x1));
    }
    if ((cfg->PixelSnapH & 1U) != 0) {
      auVar6 = vcvtdq2ps_avx(ZEXT416((uint)(int)(fVar16 + 0.5)));
      fVar16 = auVar6._0_4_;
    }
    advance_x = fVar16 + (cfg->GlyphExtraSpacing).x;
  }
  iVar2 = (this->Glyphs).Size;
  iVar3 = (this->Glyphs).Capacity;
  uVar1 = iVar2 + 1;
  if (iVar3 <= iVar2) {
    if (iVar3 == 0) {
      uVar8 = 8;
    }
    else {
      uVar8 = iVar3 / 2 + iVar3;
    }
    if ((int)uVar8 <= (int)uVar1) {
      uVar8 = uVar1;
    }
    __dest = (ImFontGlyph *)ImGui::MemAlloc((long)(int)uVar8 * 0x28);
    pIVar4 = (this->Glyphs).Data;
    if (pIVar4 != (ImFontGlyph *)0x0) {
      memcpy(__dest,pIVar4,(long)(this->Glyphs).Size * 0x28);
      ImGui::MemFree((this->Glyphs).Data);
    }
    (this->Glyphs).Data = __dest;
    (this->Glyphs).Capacity = uVar8;
  }
  (this->Glyphs).Size = uVar1;
  if (-1 < iVar2) {
    pIVar4 = (this->Glyphs).Data;
    auVar6 = vcmpps_avx(auVar9,auVar12,4);
    auVar7 = vcmpps_avx(auVar11._0_16_,auVar14._0_16_,4);
    auVar6 = vandps_avx(auVar7,auVar6);
    *(uint *)(pIVar4 + ((ulong)uVar1 - 1)) = (uint)codepoint * 4 + (auVar6._0_4_ & 1) * 2;
    pIVar4[(ulong)uVar1 - 1].X0 = auVar9._0_4_;
    pIVar4[(ulong)uVar1 - 1].Y0 = y0;
    pIVar4[(ulong)uVar1 - 1].X1 = auVar12._0_4_;
    pIVar4[(ulong)uVar1 - 1].Y1 = y1;
    pIVar4[(ulong)uVar1 - 1].U0 = u0;
    pIVar4[(ulong)uVar1 - 1].V0 = v0;
    pIVar4[(ulong)uVar1 - 1].U1 = u1;
    pIVar4[(ulong)uVar1 - 1].V1 = v1;
    pIVar4[(ulong)uVar1 - 1].AdvanceX = advance_x;
    pIVar5 = this->ContainerAtlas;
    fVar16 = (float)pIVar5->TexGlyphPadding + 0.99;
    this->DirtyLookupTables = true;
    this->MetricsTotalSurface =
         this->MetricsTotalSurface +
         (int)((v1 - v0) * (float)pIVar5->TexHeight + fVar16) *
         (int)((u1 - u0) * (float)pIVar5->TexWidth + fVar16);
    return;
  }
  __assert_fail("Size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.h"
                ,0x674,"T &ImVector<ImFontGlyph>::back() [T = ImFontGlyph]");
}

Assistant:

void ImFont::AddGlyph(const ImFontConfig* cfg, ImWchar codepoint, float x0, float y0, float x1, float y1, float u0, float v0, float u1, float v1, float advance_x)
{
    if (cfg != NULL)
    {
        // Clamp & recenter if needed
        const float advance_x_original = advance_x;
        advance_x = ImClamp(advance_x, cfg->GlyphMinAdvanceX, cfg->GlyphMaxAdvanceX);
        if (advance_x != advance_x_original)
        {
            float char_off_x = cfg->PixelSnapH ? ImFloor((advance_x - advance_x_original) * 0.5f) : (advance_x - advance_x_original) * 0.5f;
            x0 += char_off_x;
            x1 += char_off_x;
        }

        // Snap to pixel
        if (cfg->PixelSnapH)
            advance_x = IM_ROUND(advance_x);

        // Bake spacing
        advance_x += cfg->GlyphExtraSpacing.x;
    }

    Glyphs.resize(Glyphs.Size + 1);
    ImFontGlyph& glyph = Glyphs.back();
    glyph.Codepoint = (unsigned int)codepoint;
    glyph.Visible = (x0 != x1) && (y0 != y1);
    glyph.Colored = false;
    glyph.X0 = x0;
    glyph.Y0 = y0;
    glyph.X1 = x1;
    glyph.Y1 = y1;
    glyph.U0 = u0;
    glyph.V0 = v0;
    glyph.U1 = u1;
    glyph.V1 = v1;
    glyph.AdvanceX = advance_x;

    // Compute rough surface usage metrics (+1 to account for average padding, +0.99 to round)
    // We use (U1-U0)*TexWidth instead of X1-X0 to account for oversampling.
    float pad = ContainerAtlas->TexGlyphPadding + 0.99f;
    DirtyLookupTables = true;
    MetricsTotalSurface += (int)((glyph.U1 - glyph.U0) * ContainerAtlas->TexWidth + pad) * (int)((glyph.V1 - glyph.V0) * ContainerAtlas->TexHeight + pad);
}